

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::unroll_array_to_complex_store
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id)

{
  BaseType expr_type;
  bool bVar1;
  uint32_t uVar2;
  SPIRVariable *var_00;
  bool *pbVar3;
  uint *puVar4;
  CompilerError *this_00;
  char (*ts_1) [4];
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  SPIRType target_type;
  string local_78;
  undefined1 local_58 [8];
  string array_expr;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t source_id_local;
  uint32_t target_id_local;
  CompilerGLSL *this_local;
  
  if (((this->backend).force_gl_in_out_block & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    var_00 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,target_id);
    if ((var_00 == (SPIRVariable *)0x0) || (var_00->storage != Output)) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = Compiler::is_builtin_variable(&this->super_Compiler,var_00);
      if ((bVar1) &&
         (uVar2 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,BuiltIn),
         uVar2 == 0x14)) {
        array_expr.field_2._8_8_ = Compiler::expression_type(&this->super_Compiler,source_id);
        ::std::__cxx11::string::string((string *)local_58);
        pbVar3 = VectorView<bool>::back((VectorView<bool> *)(array_expr.field_2._8_8_ + 0x58));
        if ((*pbVar3 & 1U) == 0) {
          puVar4 = VectorView<unsigned_int>::back
                             ((VectorView<unsigned_int> *)(array_expr.field_2._8_8_ + 0x20));
          to_expression_abi_cxx11_
                    ((string *)&target_type.member_name_cache._M_h._M_single_bucket,this,*puVar4,
                     true);
          ::std::__cxx11::string::operator=
                    ((string *)local_58,
                     (string *)&target_type.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string
                    ((string *)&target_type.member_name_cache._M_h._M_single_bucket);
        }
        else {
          puVar4 = VectorView<unsigned_int>::back
                             ((VectorView<unsigned_int> *)(array_expr.field_2._8_8_ + 0x20));
          convert_to_string<unsigned_int,_0>(&local_78,puVar4);
          ::std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
          ::std::__cxx11::string::~string((string *)&local_78);
          puVar4 = VectorView<unsigned_int>::back
                             ((VectorView<unsigned_int> *)(array_expr.field_2._8_8_ + 0x20));
          if (*puVar4 == 0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Cannot unroll an array copy from unsized array.");
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        SPIRType::SPIRType((SPIRType *)local_1f8,OpTypeInt);
        target_type.super_IVariant.self.id = 7;
        statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                  (this,(char (*) [25])"for (int i = 0; i < int(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   (char (*) [8])"); i++)");
        begin_scope(this);
        to_expression_abi_cxx11_(&local_218,this,target_id,true);
        expr_type = *(BaseType *)(array_expr.field_2._8_8_ + 0x10);
        ts_1 = (char (*) [4])0x1;
        to_expression_abi_cxx11_(&local_278,this,source_id,true);
        join<std::__cxx11::string,char_const(&)[4]>
                  (&local_258,(spirv_cross *)&local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[i]",ts_1);
        bitcast_expression(&local_238,this,(SPIRType *)local_1f8,expr_type,&local_258);
        statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                  (this,&local_218,(char (*) [7])"[i] = ",&local_238,(char (*) [2])0x6815db);
        ::std::__cxx11::string::~string((string *)&local_238);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::__cxx11::string::~string((string *)&local_278);
        ::std::__cxx11::string::~string((string *)&local_218);
        end_scope(this);
        this_local._7_1_ = true;
        SPIRType::~SPIRType((SPIRType *)local_1f8);
        ::std::__cxx11::string::~string((string *)local_58);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::unroll_array_to_complex_store(uint32_t target_id, uint32_t source_id)
{
	if (!backend.force_gl_in_out_block)
		return false;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(target_id);
	if (!var || var->storage != StorageClassOutput)
		return false;

	if (!is_builtin_variable(*var) || BuiltIn(get_decoration(var->self, DecorationBuiltIn)) != BuiltInSampleMask)
		return false;

	auto &type = expression_type(source_id);
	string array_expr;
	if (type.array_size_literal.back())
	{
		array_expr = convert_to_string(type.array.back());
		if (type.array.back() == 0)
			SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
	}
	else
		array_expr = to_expression(type.array.back());

	SPIRType target_type { OpTypeInt };
	target_type.basetype = SPIRType::Int;

	statement("for (int i = 0; i < int(", array_expr, "); i++)");
	begin_scope();
	statement(to_expression(target_id), "[i] = ",
	          bitcast_expression(target_type, type.basetype, join(to_expression(source_id), "[i]")),
	          ";");
	end_scope();

	return true;
}